

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

void __thiscall QFileDialogPrivate::navigateToParent(QFileDialogPrivate *this)

{
  QObject *this_00;
  Data *pDVar1;
  char16_t *pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  char cVar5;
  long in_FS_OFFSET;
  QDir dir;
  QArrayData *local_88;
  char16_t *pcStack_80;
  qsizetype local_78;
  QString local_68;
  undefined1 *local_50;
  anon_union_24_3_e3d07ef4_for_data local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QObject **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QFileSystemModel::rootDirectory();
  local_68.d.d = (Data *)0x0;
  local_68.d.ptr = (char16_t *)0x0;
  local_68.d.size = 0;
  cVar5 = QDir::isRoot();
  if (cVar5 == '\0') {
    QDir::cdUp();
    QDir::absolutePath();
    uVar4 = local_48._16_8_;
    uVar3 = local_48.shared;
    pcVar2 = local_68.d.ptr;
    pDVar1 = local_68.d.d;
    local_48.shared = (PrivateShared *)local_68.d.d;
    local_68.d.d = (Data *)uVar3;
    local_68.d.ptr = (char16_t *)local_48._8_8_;
    local_48._8_8_ = pcVar2;
    local_48._16_8_ = local_68.d.size;
    local_68.d.size = uVar4;
    if (&pDVar1->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar1->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    QFileSystemModel::myComputer((int)&local_48);
    ::QVariant::toString();
    pDVar1 = local_68.d.d;
    local_68.d.d = (Data *)local_88;
    local_68.d.ptr = pcStack_80;
    local_68.d.size = local_78;
    if (&pDVar1->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar1->super_QArrayData,2,0x10);
      }
    }
    ::QVariant::~QVariant((QVariant *)&local_48);
  }
  QFileDialog::setDirectory((QFileDialog *)this_00,&local_68);
  local_48.shared = (PrivateShared *)0x0;
  local_48._8_8_ = &local_68;
  QMetaObject::activate(this_00,&QFileDialog::staticMetaObject,3,&local_48.shared);
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  QDir::~QDir((QDir *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::navigateToParent()
{
    Q_Q(QFileDialog);
    QDir dir(model->rootDirectory());
    QString newDirectory;
    if (dir.isRoot()) {
        newDirectory = model->myComputer().toString();
    } else {
        dir.cdUp();
        newDirectory = dir.absolutePath();
    }
    q->setDirectory(newDirectory);
    emit q->directoryEntered(newDirectory);
}